

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O0

t_int * sigrfft_flip(t_int *w)

{
  int local_24;
  t_int tStack_20;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  local_24 = (int)w[3];
  tStack_20 = w[2];
  out = (t_sample *)w[1];
  while (local_24 != 0) {
    *(float *)(tStack_20 + -4) = -*out;
    local_24 = local_24 + -1;
    tStack_20 = tStack_20 + -4;
    out = out + 1;
  }
  return w + 4;
}

Assistant:

static t_int *sigrfft_flip(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    while (n--)
        *(--out) = - *in++;
    return (w+4);
}